

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::anon_unknown_1::CoordVertexShader::shadeVertices
          (CoordVertexShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  float fVar1;
  float *pfVar2;
  Vector<float,_4> local_60;
  Vector<float,_4> local_50;
  undefined1 local_40 [8];
  Vec4 position;
  VertexPacket *packet;
  int packetNdx;
  int numPackets_local;
  VertexPacket **packets_local;
  VertexAttrib *inputs_local;
  CoordVertexShader *this_local;
  
  for (packet._0_4_ = 0; (int)packet < numPackets; packet._0_4_ = (int)packet + 1) {
    position.m_data._8_8_ = packets[(int)packet];
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_40);
    rr::readVertexAttrib
              ((Vec4 *)local_40,inputs,*(int *)position.m_data._8_8_,
               *(int *)(position.m_data._8_8_ + 4));
    tcu::Vector<float,_4>::Vector(&local_50,1.0);
    rr::GenericVec4::operator=((GenericVec4 *)(position.m_data._8_8_ + 0x20),&local_50);
    pfVar2 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_40);
    fVar1 = *pfVar2;
    pfVar2 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_40);
    tcu::Vector<float,_4>::Vector(&local_60,(fVar1 - 0.5) * 2.0,(*pfVar2 - 0.5) * 2.0,0.0,1.0);
    *(undefined8 *)(position.m_data._8_8_ + 8) = local_60.m_data._0_8_;
    *(undefined8 *)(position.m_data._8_8_ + 0x10) = local_60.m_data._8_8_;
  }
  return;
}

Assistant:

void shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; packetNdx++)
		{
			rr::VertexPacket* const		packet		= packets[packetNdx];
			tcu::Vec4					position;

			readVertexAttrib(position, inputs[0], packet->instanceNdx, packet->vertexNdx);

			packet->outputs[0]	= tcu::Vec4(1.0f);
			packet->position	= tcu::Vec4(2.0f * (position.x() - 0.5f), 2.0f * (position.y() - 0.5f), 0.0f, 1.0f);
		}
	}